

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

double get_kf_boost_score(AV1_COMP *cpi,double kf_raw_err,double *zero_motion_accumulator,
                         double *sr_accumulator,int use_avg_stat)

{
  double dVar1;
  AV1_PRIMARY *pAVar2;
  FIRSTPASS_STATS *pFVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined8 extraout_XMM0_Qb;
  double dVar21;
  FIRSTPASS_STATS cur_frame;
  double local_240;
  undefined1 local_210 [16];
  double dStack_200;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_128 [16];
  FIRSTPASS_STATS local_118;
  
  pAVar2 = cpi->ppi;
  uVar15 = 0;
  memset(local_210,0,0xe8);
  if ((cpi->oxcf).rc_cfg.mode == AOM_Q) {
    dVar16 = (double)(cpi->rc).frames_to_key;
    dVar16 = dVar16 + dVar16;
    local_128 = ZEXT816(0x4054000000000000);
    if (80.0 < dVar16) {
      local_128._8_8_ = 0;
      local_128._0_8_ =
           -(ulong)(dVar16 < 128.0) & 0x4054000000000000 |
           ~-(ulong)(dVar16 < 128.0) & 0x4060000000000000;
    }
    if (80.0 < dVar16 && dVar16 < 128.0) {
      local_128._8_8_ = extraout_XMM0_Qb;
      local_128._0_8_ = dVar16;
    }
  }
  else {
    local_128 = ZEXT816(0x4060000000000000);
  }
  if (use_avg_stat != 0) {
    uVar15 = 0;
    memset(&local_118,0,0xe8);
    while (((int)uVar15 < (cpi->rc).frames_to_key + -1 &&
           (pFVar3 = (cpi->twopass_frame).stats_in,
           pFVar3 < ((pAVar2->twopass).stats_buf_ctx)->stats_in_end))) {
      memcpy(&local_118,pFVar3,0xe8);
      (cpi->twopass_frame).stats_in = pFVar3 + 1;
      av1_accumulate_stats((FIRSTPASS_STATS *)local_210,&local_118);
      uVar15 = uVar15 + 1;
    }
    if (1 < uVar15) {
      dVar16 = (double)(int)uVar15;
      auVar4._8_8_ = dVar16;
      auVar4._0_8_ = dVar16;
      register0x00001240 = divpd(stack0xfffffffffffffdf8,auVar4);
      auVar5._8_8_ = dVar16;
      auVar5._0_8_ = dVar16;
      local_1f8 = divpd(local_1f8,auVar5);
      auVar6._8_8_ = dVar16;
      auVar6._0_8_ = dVar16;
      local_1e8 = divpd(local_1e8,auVar6);
      auVar7._8_8_ = dVar16;
      auVar7._0_8_ = dVar16;
      local_1d8 = divpd(local_1d8,auVar7);
      auVar8._8_8_ = dVar16;
      auVar8._0_8_ = dVar16;
      local_1c8 = divpd(local_1c8,auVar8);
      auVar9._8_8_ = dVar16;
      auVar9._0_8_ = dVar16;
      local_1b8 = divpd(local_1b8,auVar9);
      auVar10._8_8_ = dVar16;
      auVar10._0_8_ = dVar16;
      local_1a8 = divpd(local_1a8,auVar10);
      auVar11._8_8_ = dVar16;
      auVar11._0_8_ = dVar16;
      local_198 = divpd(local_198,auVar11);
      auVar12._8_8_ = dVar16;
      auVar12._0_8_ = dVar16;
      local_188 = divpd(local_188,auVar12);
      auVar13._8_8_ = dVar16;
      auVar13._0_8_ = dVar16;
      local_178 = divpd(local_178,auVar13);
      auVar14._8_8_ = dVar16;
      auVar14._0_8_ = dVar16;
      local_168 = divpd(local_168,auVar14);
    }
  }
  local_240 = 0.0;
  do {
    if ((cpi->rc).frames_to_key + -1 <= (int)uVar15) {
      return local_240;
    }
    if (use_avg_stat == 0) {
      pFVar3 = (cpi->twopass_frame).stats_in;
      if (((pAVar2->twopass).stats_buf_ctx)->stats_in_end <= pFVar3) {
        return local_240;
      }
      memcpy((FIRSTPASS_STATS *)local_210,pFVar3,0xe8);
      (cpi->twopass_frame).stats_in = pFVar3 + 1;
    }
    if (uVar15 == 0) {
      dVar16 = (double)local_1e8._8_8_ - (double)local_1d8._0_8_;
    }
    else {
      dVar16 = *zero_motion_accumulator;
      dVar17 = get_zero_motion_factor((FIRSTPASS_STATS *)local_210);
      if (dVar17 <= dVar16) {
        dVar16 = dVar17;
      }
    }
    *zero_motion_accumulator = dVar16;
    if ((*sr_accumulator <= kf_raw_err * 1.5 && kf_raw_err * 1.5 != *sr_accumulator) &&
       ((int)uVar15 <= (cpi->rc).max_gf_interval * 2)) {
      if (uVar15 < 2) {
        *sr_accumulator = 0.0;
      }
      dVar18 = av1_convert_qindex_to_q
                         ((cpi->ppi->p_rc).avg_frame_qindex[1],(cpi->frame_info).bit_depth);
      dVar19 = calculate_active_area(&cpi->frame_info,(FIRSTPASS_STATS *)local_210);
      dVar17 = *(double *)
                (&DAT_00463dc0 +
                (ulong)((uint)((cpi->frame_info).frame_width * (cpi->frame_info).frame_height) <
                       0x38401) * 8) * dVar19;
      if (*(double *)
           (&DAT_00463dc0 +
           (ulong)((uint)((cpi->frame_info).frame_width * (cpi->frame_info).frame_height) < 0x38401)
           * 8) * dVar19 <= dStack_200 * dVar19) {
        dVar17 = dStack_200 * dVar19;
      }
      dVar19 = ((double)local_1f8._8_8_ + *sr_accumulator) * dVar19;
      dVar1 = *(double *)(&DAT_00441af0 + (ulong)(dVar19 < 0.0) * 8);
      dVar21 = ((double)local_1e8._0_8_ - (double)local_1f8._8_8_) + *sr_accumulator;
      dVar20 = 0.0;
      if (0.0 <= dVar21) {
        dVar20 = dVar21;
      }
      dVar18 = dVar18 * 0.015 + 0.5;
      if (2.0 <= dVar18) {
        dVar18 = 2.0;
      }
      *sr_accumulator = dVar20;
      dVar17 = (dVar17 / (dVar19 + dVar1) + 40.0) * dVar18;
      if (dVar18 * (double)local_128._0_8_ <= dVar17) {
        dVar17 = dVar18 * (double)local_128._0_8_;
      }
      local_240 = local_240 + dVar17 * (dVar16 * 0.5 + 0.75);
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

static double get_kf_boost_score(AV1_COMP *cpi, double kf_raw_err,
                                 double *zero_motion_accumulator,
                                 double *sr_accumulator, int use_avg_stat) {
  RATE_CONTROL *const rc = &cpi->rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  FIRSTPASS_STATS frame_stat;
  av1_zero(frame_stat);
  int i = 0, num_stat_used = 0;
  double boost_score = 0.0;
  const double kf_max_boost =
      cpi->oxcf.rc_cfg.mode == AOM_Q
          ? AOMMIN(AOMMAX(rc->frames_to_key * 2.0, KF_MIN_FRAME_BOOST),
                   KF_MAX_FRAME_BOOST)
          : KF_MAX_FRAME_BOOST;

  // Calculate the average using available number of stats.
  if (use_avg_stat) num_stat_used = calc_avg_stats(cpi, &frame_stat);

  for (i = num_stat_used; i < (rc->frames_to_key - 1); ++i) {
    if (!use_avg_stat &&
        EOF == input_stats(twopass, &cpi->twopass_frame, &frame_stat))
      break;

    // Monitor for static sections.
    // For the first frame in kf group, the second ref indicator is invalid.
    if (i > 0) {
      *zero_motion_accumulator =
          AOMMIN(*zero_motion_accumulator, get_zero_motion_factor(&frame_stat));
    } else {
      *zero_motion_accumulator = frame_stat.pcnt_inter - frame_stat.pcnt_motion;
    }

    // Not all frames in the group are necessarily used in calculating boost.
    if ((*sr_accumulator < (kf_raw_err * 1.50)) &&
        (i <= rc->max_gf_interval * 2)) {
      double frame_boost;
      double zm_factor;

      // Factor 0.75-1.25 based on how much of frame is static.
      zm_factor = (0.75 + (*zero_motion_accumulator / 2.0));

      if (i < 2) *sr_accumulator = 0.0;
      frame_boost =
          calc_kf_frame_boost(&cpi->ppi->p_rc, frame_info, &frame_stat,
                              sr_accumulator, kf_max_boost);
      boost_score += frame_boost * zm_factor;
    }
  }
  return boost_score;
}